

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

void __thiscall
QPDFObjectHandle::writeJSON
          (QPDFObjectHandle *this,int json_version,Writer *p,bool dereference_indirect)

{
  bool bVar1;
  Writer *pWVar2;
  logic_error *this_00;
  QPDFObjGen local_60;
  string local_58;
  string_view local_38;
  undefined1 local_21;
  Writer *pWStack_20;
  bool dereference_indirect_local;
  Writer *p_local;
  QPDFObjectHandle *pQStack_10;
  int json_version_local;
  QPDFObjectHandle *this_local;
  
  local_21 = dereference_indirect;
  pWStack_20 = p;
  p_local._4_4_ = json_version;
  pQStack_10 = this;
  if ((dereference_indirect) || (bVar1 = isIndirect(this), !bVar1)) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
    if (!bVar1) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (this_00,"attempted to dereference an uninitialized QPDFObjectHandle");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    ::qpdf::BaseHandle::write_json(&this->super_BaseHandle,p_local._4_4_,pWStack_20);
  }
  else {
    pWVar2 = JSON::Writer::operator<<(pWStack_20,"\"");
    local_60 = getObjGen(this);
    QPDFObjGen::unparse_abi_cxx11_(&local_58,&local_60,' ');
    local_38 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_58);
    pWVar2 = JSON::Writer::operator<<(pWVar2,local_38);
    JSON::Writer::operator<<(pWVar2," R\"");
    std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

void
QPDFObjectHandle::writeJSON(int json_version, JSON::Writer& p, bool dereference_indirect) const
{
    if (!dereference_indirect && isIndirect()) {
        p << "\"" << getObjGen().unparse(' ') << " R\"";
    } else if (!obj) {
        throw std::logic_error("attempted to dereference an uninitialized QPDFObjectHandle");
    } else {
        write_json(json_version, p);
    }
}